

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_Oscilloscope.cpp
# Opt level: O2

int Oscilloscope::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  UnityComplexNumber *data;
  int n_1;
  EffectData *pEVar1;
  ulong uVar2;
  long lVar3;
  long lVar4;
  float (*pafVar5) [8192];
  float fVar6;
  undefined1 *puVar7;
  HistoryBuffer *this;
  ulong uVar8;
  bool bVar9;
  uint uVar10;
  float fVar11;
  float fVar12;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<Oscilloscope::EffectData>(state);
  memcpy(outbuffer,inbuffer,(ulong)length * (long)inchannels * 4);
  puVar7 = &pEVar1->field_0x10;
  uVar8 = 0;
  this = (HistoryBuffer *)puVar7;
  uVar2 = uVar8;
  if (0 < inchannels) {
    uVar8 = (ulong)(uint)inchannels;
    uVar2 = uVar8;
  }
  while (bVar9 = uVar8 != 0, uVar8 = uVar8 - 1, bVar9) {
    HistoryBuffer::Feed(this,inbuffer,length,inchannels);
    inbuffer = inbuffer + 1;
    this = this + 1;
  }
  if (1.0 <= pEVar1->p[2]) {
    data = pEVar1->fftbuf;
    pafVar5 = pEVar1->smoothspec;
    for (uVar8 = 0; uVar8 != uVar2; uVar8 = uVar8 + 1) {
      fVar6 = pEVar1->p[uVar8 * 4 + 5];
      memset(data,0,0x10000);
      lVar3 = *(long *)(pEVar1->p + uVar8 * 4 + 6);
      fVar11 = 0.0;
      fVar12 = 1.0;
      for (lVar4 = 0; lVar4 != 0x1000; lVar4 = lVar4 + 1) {
        data[lVar4].re = (fVar12 * -0.5 + 0.5) * *(float *)(lVar3 + (long)(int)fVar6 * 4);
        if ((int)fVar6 < 1) {
          fVar6 = *(float *)(puVar7 + uVar8 * 0x10);
        }
        fVar11 = fVar11 + fVar12 * 0.0015339807;
        fVar12 = fVar12 - fVar11 * 0.0015339807;
        fVar6 = (float)((int)fVar6 + -1);
      }
      FFT::Forward(data,0x2000,true);
      fVar6 = powf(10.0,(pEVar1->p[3] * 0.05 * (float)length) /
                        (float)(state->field_0).field_0.samplerate);
      for (lVar3 = 0; lVar3 != 0x1000; lVar3 = lVar3 + 1) {
        fVar11 = pEVar1->fftbuf[lVar3].re;
        fVar12 = pEVar1->fftbuf[lVar3].im;
        fVar11 = SQRT(fVar11 * fVar11 + fVar12 * fVar12);
        uVar10 = -(uint)((*pafVar5)[lVar3] < fVar11);
        (*pafVar5)[lVar3] =
             (float)(~uVar10 & (uint)(fVar6 * (*pafVar5)[lVar3]) | (uint)fVar11 & uVar10);
      }
      HistoryBuffer::Feed((HistoryBuffer *)(&pEVar1->field_0x90 + uVar8 * 0x10),
                          pEVar1->smoothspec[uVar8],0x1000,1);
      pafVar5 = pafVar5 + 1;
    }
  }
  pEVar1->numchannels = inchannels;
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        memcpy(outbuffer, inbuffer, sizeof(float) * length * inchannels);

        for (int i = 0; i < inchannels; i++)
            data->history[i].Feed(inbuffer + i, length, inchannels);

        if (data->p[P_Mode] >= 1.0f)
        {
            for (int i = 0; i < inchannels; i++)
            {
                HistoryBuffer& history = data->history[i];
                HistoryBuffer& spectrum = data->spectrum[i];
                int windowsize = FFTSIZE / 2;
                int w = history.writeindex;
                float c = 1.0f, s = 0.0f, f = 2.0f * sinf(kPI / (float)windowsize);
                memset(data->fftbuf, 0, sizeof(UnityComplexNumber) * FFTSIZE);
                for (int n = 0; n < windowsize; n++)
                {
                    data->fftbuf[n].re = history.data[w] * (0.5f - 0.5f * c);
                    s += c * f;
                    c -= s * f;
                    if (--w < 0)
                        w = history.length - 1;
                }
                FFT::Forward(data->fftbuf, FFTSIZE, true);
                float specdecay = powf(10.0f, 0.05f * data->p[P_SpectrumDecay] * length / (float)state->samplerate);
                for (int n = 0; n < FFTSIZE / 2; n++)
                {
                    float a = data->fftbuf[n].Magnitude();
                    data->smoothspec[i][n] = (a > data->smoothspec[i][n]) ? a : data->smoothspec[i][n] * specdecay;
                }
                spectrum.Feed(data->smoothspec[i], FFTSIZE / 2, 1);
            }
        }

        data->numchannels = inchannels;

        return UNITY_AUDIODSP_OK;
    }